

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O2

string * __thiscall
t_netstd_generator::get_deep_copy_method_call_abi_cxx11_
          (string *__return_storage_ptr__,t_netstd_generator *this,t_type *ttype,
          bool *needs_typecast)

{
  int iVar1;
  t_type *ptVar2;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  ptVar2 = resolve_typedef(ttype);
  *needs_typecast = false;
  iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[5])(ptVar2);
  if ((char)iVar1 == '\0') {
    iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[10])(ptVar2);
    if ((char)iVar1 == '\0') {
      iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[0xd])(ptVar2);
      *needs_typecast = (bool)((byte)iVar1 ^ 1);
      std::operator+(&bStack_38,".",&DEEP_COPY_METHOD_NAME_abi_cxx11_);
      std::operator+(__return_storage_ptr__,&bStack_38,"()");
      std::__cxx11::string::~string((string *)&bStack_38);
      return __return_storage_ptr__;
    }
  }
  else if ((*(int *)&ptVar2[1].super_t_doc._vptr_t_doc == 1) &&
          (iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[7])(ptVar2), (char)iVar1 != '\0')) {
    pcVar3 = ".ToArray()";
    goto LAB_00246851;
  }
  pcVar3 = "";
LAB_00246851:
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,(allocator *)&bStack_38);
  return __return_storage_ptr__;
}

Assistant:

string t_netstd_generator::get_deep_copy_method_call(t_type* ttype, bool& needs_typecast)
{
    ttype = resolve_typedef(ttype);

    needs_typecast = false;
    if (ttype->is_base_type())
    {
        t_base_type::t_base tbase = static_cast<t_base_type*>(ttype)->get_base();
        switch (tbase)
        {
        case t_base_type::TYPE_STRING:
            if (ttype->is_binary())
            {
                return ".ToArray()";
            } else {
                return "";  // simple assignment will do, strings are immutable in C#
            }
            break;
        default:
            return "";  // simple assignment will do
        }
    }
    else if (ttype->is_enum())
    {
        return "";  // simple assignment will do
    }
    else
    {
        needs_typecast = (! ttype->is_container());
        return "." + DEEP_COPY_METHOD_NAME + "()";
    }
}